

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdesinfo.cpp
# Opt level: O0

int __thiscall
jrtplib::RTCPSDESInfo::SetPrivateValue
          (RTCPSDESInfo *this,uint8_t *prefix,size_t prefixlen,uint8_t *value,size_t valuelen)

{
  int iVar1;
  reference ppSVar2;
  size_type sVar3;
  RTPMemoryManager *pRVar4;
  SDESPrivateItem *pSVar5;
  bool local_a1;
  SDESPrivateItem *pSStack_80;
  int status;
  SDESPrivateItem *item;
  size_t l;
  uint8_t *p;
  _List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*> local_60;
  iterator local_58;
  _List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*> local_50;
  byte local_41;
  _List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*> _Stack_40;
  bool found;
  const_iterator it;
  size_t valuelen_local;
  uint8_t *value_local;
  size_t prefixlen_local;
  uint8_t *prefix_local;
  RTCPSDESInfo *this_local;
  
  it._M_node = (_List_node_base *)valuelen;
  std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::_List_const_iterator
            (&stack0xffffffffffffffc0);
  local_41 = 0;
  local_58._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
       ::begin(&this->privitems);
  std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::_List_const_iterator
            (&local_50,&local_58);
  _Stack_40._M_node = local_50._M_node;
  while( true ) {
    local_a1 = false;
    if ((local_41 & 1) == 0) {
      p = (uint8_t *)
          std::__cxx11::
          list<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
          ::end(&this->privitems);
      std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::_List_const_iterator
                (&local_60,(iterator *)&p);
      local_a1 = std::operator!=(&stack0xffffffffffffffc0,&local_60);
    }
    if (local_a1 == false) break;
    ppSVar2 = std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::operator*
                        (&stack0xffffffffffffffc0);
    l = (size_t)SDESPrivateItem::GetPrefix(*ppSVar2,(size_t *)&item);
    if (item == (SDESPrivateItem *)prefixlen) {
      if (item == (SDESPrivateItem *)0x0) {
        local_41 = 1;
      }
      else {
        iVar1 = memcmp(prefix,(void *)l,(size_t)item);
        if (iVar1 == 0) {
          local_41 = 1;
        }
        else {
          std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::operator++
                    (&stack0xffffffffffffffc0);
        }
      }
    }
    else {
      std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::operator++
                (&stack0xffffffffffffffc0);
    }
  }
  if ((local_41 & 1) == 0) {
    sVar3 = std::__cxx11::
            list<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
            ::size(&this->privitems);
    if (0xff < sVar3) {
      return -0x38;
    }
    pRVar4 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    pSVar5 = (SDESPrivateItem *)operator_new(0x30,pRVar4,0x1e);
    pRVar4 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    SDESPrivateItem::SDESPrivateItem(pSVar5,pRVar4);
    if (pSVar5 == (SDESPrivateItem *)0x0) {
      return -1;
    }
    pSStack_80 = pSVar5;
    iVar1 = SDESPrivateItem::SetPrefix(pSVar5,prefix,prefixlen);
    pSVar5 = pSStack_80;
    if (iVar1 < 0) {
      pRVar4 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
      RTPDelete<jrtplib::RTCPSDESInfo::SDESPrivateItem>(pSVar5,pRVar4);
      return iVar1;
    }
    std::__cxx11::
    list<jrtplib::RTCPSDESInfo::SDESPrivateItem_*,_std::allocator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>_>
    ::push_front(&this->privitems,&stack0xffffffffffffff80);
  }
  else {
    ppSVar2 = std::_List_const_iterator<jrtplib::RTCPSDESInfo::SDESPrivateItem_*>::operator*
                        (&stack0xffffffffffffffc0);
    pSStack_80 = *ppSVar2;
  }
  iVar1 = SDESItem::SetInfo(&pSStack_80->super_SDESItem,value,(size_t)it._M_node);
  return iVar1;
}

Assistant:

int RTCPSDESInfo::SetPrivateValue(const uint8_t *prefix,size_t prefixlen,const uint8_t *value,size_t valuelen)
{
	std::list<SDESPrivateItem *>::const_iterator it;
	bool found;
	
	found = false;
	it = privitems.begin();
	while (!found && it != privitems.end())
	{
		uint8_t *p;
		size_t l;
		
		p = (*it)->GetPrefix(&l);
		if (l == prefixlen)
		{
			if (l <= 0)
				found = true;
			else if (memcmp(prefix,p,l) == 0)
				found = true;
			else
				++it;
		}
		else
			++it;
	}
	
	SDESPrivateItem *item;
	
	if (found) // replace the value for this entry
		item = *it;
	else // no entry for this prefix found... add it
	{
		if (privitems.size() >= RTP_MAXPRIVITEMS) // too many items present, just ignore it
			return ERR_RTP_SDES_MAXPRIVITEMS;
		
		int status;
		
		item = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_SDESPRIVATEITEM) SDESPrivateItem(GetMemoryManager());
		if (item == 0)
			return ERR_RTP_OUTOFMEM;
		if ((status = item->SetPrefix(prefix,prefixlen)) < 0)
		{
			RTPDelete(item,GetMemoryManager());
			return status;
		}
		privitems.push_front(item);
	}
	return item->SetInfo(value,valuelen);
}